

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_unk68(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk68.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk68.version;
  if ((bios->power).unk68.valid != '\0') {
    fprintf((FILE *)out,"VOLTAGE RAIL table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk68.offset,(uint)(bios->power).unk68.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).unk68.entriesnum != '\0') {
      uVar2 = 0;
      do {
        envy_bios_dump_hex(bios,out,(bios->power).unk68.entries[uVar2].offset,
                           (uint)(bios->power).unk68.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (bios->power).unk68.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse VOLTAGE RAIL table at 0x%x, version %x\n",(ulong)uVar1,uVar2)
  ;
  return;
}

Assistant:

void envy_bios_print_power_unk68(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk68 *unk68 = &bios->power.unk68;
	int i;

	if (!unk68->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk68->valid) {
		fprintf(out, "Failed to parse VOLTAGE RAIL table at 0x%x, version %x\n", unk68->offset, unk68->version);
		return;
	}

	fprintf(out, "VOLTAGE RAIL table at 0x%x, version %x\n", unk68->offset, unk68->version);
	envy_bios_dump_hex(bios, out, unk68->offset, unk68->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk68->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk68->entries[i].offset, unk68->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}